

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O2

void copylist(List *l,Item *i)

{
  Item *pIVar1;
  
  pIVar1 = l;
  while( true ) {
    while( true ) {
      pIVar1 = pIVar1->next;
      if (pIVar1 == l) {
        return;
      }
      if (pIVar1->itemtype != 1) break;
      insertsym(i,(pIVar1->element).sym);
    }
    if (pIVar1->itemtype != 0x143) break;
    insertstr(i,(pIVar1->element).str);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/deriv.c"
                ,0x3e0,"void copylist()");
}

Assistant:

static void copylist(l, i)	/* copy list l before item i */
	List *l;
	Item *i;
{
	Item *q;
	
	ITERATE(q, l) {
		switch(q->itemtype) {

		case STRING:
			Insertstr(i, STR(q));
			break;
		case SYMBOL:
			Insertsym(i, SYM(q));
			break;
		default:
			/*SUPPRESS 622*/
			assert(0);
		}
	}
}